

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::getIntOptionValues
          (Highs *this,string *option,HighsInt *current_value,HighsInt *min_value,
          HighsInt *max_value,HighsInt *default_value)

{
  OptionStatus OVar1;
  HighsInt *in_stack_00000050;
  undefined4 local_4;
  
  OVar1 = getLocalOptionValues
                    ((HighsLogOptions *)this,option,
                     (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)current_value,
                     min_value,max_value,default_value,in_stack_00000050);
  if (OVar1 == kOk) {
    local_4 = kOk;
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getIntOptionValues(const std::string& option,
                                      HighsInt* current_value,
                                      HighsInt* min_value, HighsInt* max_value,
                                      HighsInt* default_value) const {
  if (getLocalOptionValues(options_.log_options, option, options_.records,
                           current_value, min_value, max_value,
                           default_value) != OptionStatus::kOk)
    return HighsStatus::kError;
  return HighsStatus::kOk;
}